

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2.cpp
# Opt level: O0

void rw::ps2::registerNativeDataPlugin(void)

{
  Geometry::registerPlugin(0,0x510,(Constructor)0x0,destroyNativeData,(CopyConstructor)0x0);
  Geometry::registerPluginStream(0x510,readNativeData,writeNativeData,getSizeNativeData);
  return;
}

Assistant:

void
registerNativeDataPlugin(void)
{
	Geometry::registerPlugin(0, ID_NATIVEDATA,
	                         nil, destroyNativeData, nil);
	Geometry::registerPluginStream(ID_NATIVEDATA,
	                               readNativeData,
	                               writeNativeData,
	                               getSizeNativeData);
}